

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

UBool __thiscall icu_63::UStringSet::adopt(UStringSet *this,UnicodeString *str,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UnicodeString *str_local;
  UStringSet *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') && (UVar1 = contains(this,str), UVar1 == '\0')) {
    UVector::sortedInsert(&this->super_UVector,str,compareUnicodeString,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      if (str != (UnicodeString *)0x0) {
        (*(str->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
      return '\0';
    }
    return '\x01';
  }
  if (str != (UnicodeString *)0x0) {
    (*(str->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  return '\0';
}

Assistant:

inline UBool adopt(UnicodeString *str, UErrorCode &status) {
    if(U_FAILURE(status) || contains(*str)) {
      delete str;
      return false;
    } else {
      sortedInsert(str, compareUnicodeString, status);
      if(U_FAILURE(status)) {
        delete str;
        return false;
      }
      return true;
    }
  }